

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall wasm::BinaryInstWriter::visitSwitch(BinaryInstWriter *this,Switch *curr)

{
  BufferWithRandomAccess *pBVar1;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  ulong uVar3;
  long lVar4;
  Name name;
  Name name_00;
  LEB<unsigned_int,_unsigned_char> local_48;
  LEB<unsigned_int,_unsigned_char> local_44;
  size_t local_40;
  LEB<unsigned_int,_unsigned_char> local_38;
  uchar local_31;
  
  this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
  local_31 = '\x0e';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_00,&local_31);
  local_44.value =
       (uint)(curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
  ;
  LEB<unsigned_int,_unsigned_char>::write(&local_44,(int)this_00,__buf,in_RCX);
  local_40 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
  ;
  if (local_40 != 0) {
    lVar4 = 8;
    uVar3 = 0;
    pvVar2 = this_00;
    do {
      if ((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements <=
          uVar3) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
                     );
      }
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      name.super_IString.str._M_str =
           *(char **)((long)&(((curr->targets).
                               super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data)->
                             super_IString).str._M_len + lVar4);
      name.super_IString.str._M_len = (size_t)pvVar2;
      local_38.value = getBreakIndex(this,name);
      LEB<unsigned_int,_unsigned_char>::write(&local_38,(int)this_00,__buf_00,in_RCX);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x10;
      pvVar2 = this_00;
    } while (local_40 != uVar3);
  }
  pBVar1 = this->o;
  name_00.super_IString.str._M_str = (curr->default_).super_IString.str._M_str;
  name_00.super_IString.str._M_len = (size_t)this_00;
  local_48.value = getBreakIndex(this,name_00);
  LEB<unsigned_int,_unsigned_char>::write(&local_48,(int)pBVar1,__buf_01,in_RCX);
  return;
}

Assistant:

void BinaryInstWriter::visitSwitch(Switch* curr) {
  o << int8_t(BinaryConsts::BrTable) << U32LEB(curr->targets.size());
  for (auto target : curr->targets) {
    o << U32LEB(getBreakIndex(target));
  }
  o << U32LEB(getBreakIndex(curr->default_));
}